

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

size_t read_cached_tag(io_buf *cache,example *ae)

{
  ulong uVar1;
  size_t sVar2;
  char *in_RSI;
  io_buf *in_RDI;
  size_t tag_size;
  char *c;
  ulong *in_stack_ffffffffffffffe0;
  v_array<char> *this;
  size_t local_8;
  
  sVar2 = io_buf::buf_read(cache,(char **)ae,(size_t)c);
  if (sVar2 < 8) {
    local_8 = 0;
  }
  else {
    uVar1 = *in_stack_ffffffffffffffe0;
    this = (v_array<char> *)(in_stack_ffffffffffffffe0 + 1);
    io_buf::set(in_RDI,(char *)this);
    sVar2 = io_buf::buf_read(cache,(char **)ae,(size_t)c);
    if (sVar2 < uVar1) {
      local_8 = 0;
    }
    else {
      v_array<char>::clear(this);
      push_many<char>((v_array<char> *)in_RDI,in_RSI,(size_t)this);
      local_8 = uVar1 + 8;
    }
  }
  return local_8;
}

Assistant:

size_t read_cached_tag(io_buf& cache, example* ae)
{
  char* c;
  size_t tag_size;
  if (cache.buf_read(c, sizeof(tag_size)) < sizeof(tag_size))
    return 0;
  tag_size = *(size_t*)c;
  c += sizeof(tag_size);
  cache.set(c);
  if (cache.buf_read(c, tag_size) < tag_size)
    return 0;

  ae->tag.clear();
  push_many(ae->tag, c, tag_size);
  return tag_size + sizeof(tag_size);
}